

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O1

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>
::putn<pstore::gsl::span<char_const,_1l>>
          (writer_base<pstore::serialize::archive::details::database_writer_policy> *this,
          span<const_char,__1L> sp)

{
  result_type rVar1;
  
  if (this->flushed_ == true) {
    assert_failed("!flushed_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                  ,0xb5);
  }
  rVar1 = details::database_writer_policy::putn<pstore::gsl::span<char_const,_1l>>
                    (&this->policy_,sp);
  if (-1 < sp.storage_.super_extent_type<_1L>.size_.size_) {
    this->bytes_consumed_ = this->bytes_consumed_ + sp.storage_.super_extent_type<_1L>.size_.size_;
    return (result_type)rVar1.a_;
  }
  assert_failed("t >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0x78);
}

Assistant:

auto putn (Span sp) -> result_type {
                    using element_type = typename Span::element_type;
                    static_assert (std::is_standard_layout<element_type>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    auto r = putn_helper::template putn<Span> (policy_, sp);
                    bytes_consumed_ += unsigned_cast (sp.size_bytes ());
                    return r;
                }